

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineSpecConstantTests.cpp
# Opt level: O1

string * __thiscall
vkt::pipeline::(anonymous_namespace)::generateSpecConstantCode_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,
          vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
          *specConstants)

{
  string *psVar1;
  ulong uVar2;
  ostream *poVar3;
  long lVar4;
  string decl;
  ostringstream code;
  long *local_368;
  long local_358 [2];
  long *local_348;
  long local_340;
  long local_338 [2];
  string *local_328;
  ostringstream local_320 [112];
  ios_base local_2b0 [264];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  local_328 = __return_storage_ptr__;
  std::__cxx11::ostringstream::ostringstream(local_320);
  lVar4 = *(long *)this;
  if (lVar4 != *(long *)(this + 8)) {
    do {
      local_348 = local_338;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_348,*(long *)(lVar4 + 8),
                 *(long *)(lVar4 + 0x10) + *(long *)(lVar4 + 8));
      uVar2 = std::__cxx11::string::find((char *)&local_348,0xb0f480,0);
      if (uVar2 != 0xffffffffffffffff) {
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream(local_1a8);
        std::ios_base::~ios_base(local_138);
        std::__cxx11::string::replace((ulong)&local_348,uVar2,(char *)0x5,(ulong)local_368);
        if (local_368 != local_358) {
          operator_delete(local_368,local_358[0] + 1);
        }
      }
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_320,(char *)local_348,local_340);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
      if (local_348 != local_338) {
        operator_delete(local_348,local_338[0] + 1);
      }
      lVar4 = lVar4 + 0x38;
    } while (lVar4 != *(long *)(this + 8));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"\n",1);
  psVar1 = local_328;
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_320);
  std::ios_base::~ios_base(local_2b0);
  return psVar1;
}

Assistant:

std::string generateSpecConstantCode (const std::vector<SpecConstant>& specConstants)
{
	std::ostringstream code;
	for (std::vector<SpecConstant>::const_iterator it = specConstants.begin(); it != specConstants.end(); ++it)
	{
		std::string decl = it->declarationCode;
		const std::string::size_type pos = decl.find("${ID}");
		if (pos != std::string::npos)
			decl.replace(pos, 5, de::toString(it->specID));
		code << decl << "\n";
	}
	code << "\n";
	return code.str();
}